

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O1

Clifford * operator+(Clifford *__return_storage_ptr__,Clifford *A,Clifford *B)

{
  pointer *ppBVar1;
  iterator iVar2;
  Blade in_RAX;
  pointer pBVar3;
  pointer pBVar4;
  float tVal;
  Blade local_38;
  
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pBVar4 = (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pBVar3 = (B->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  local_38 = in_RAX;
  if (pBVar4 != (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      if (pBVar3 == (B->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
                    super__Vector_impl_data._M_finish) break;
      if (pBVar4->mBase < pBVar3->mBase) {
        Blade::Blade(&local_38,pBVar4->mBase,pBVar4->mVal);
        iVar2._M_current =
             (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Blade,_std::allocator<Blade>_>::_M_realloc_insert<Blade>
                    (__return_storage_ptr__,iVar2,&local_38);
        }
        else {
          *iVar2._M_current = local_38;
          ppBVar1 = &(__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppBVar1 = *ppBVar1 + 1;
        }
        Blade::~Blade(&local_38);
        pBVar4 = pBVar4 + 1;
      }
      else {
        if (pBVar4->mBase == pBVar3->mBase) {
          tVal = pBVar4->mVal + pBVar3->mVal;
          if (1e-06 < ABS(tVal)) {
            Blade::Blade(&local_38,pBVar4->mBase,tVal);
            iVar2._M_current =
                 (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl
                 .super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<Blade,_std::allocator<Blade>_>::_M_realloc_insert<Blade>
                        (__return_storage_ptr__,iVar2,&local_38);
            }
            else {
              *iVar2._M_current = local_38;
              ppBVar1 = &(__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppBVar1 = *ppBVar1 + 1;
            }
            Blade::~Blade(&local_38);
          }
          pBVar4 = pBVar4 + 1;
        }
        else {
          Blade::Blade(&local_38,pBVar3->mBase,pBVar3->mVal);
          iVar2._M_current =
               (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Blade,_std::allocator<Blade>_>::_M_realloc_insert<Blade>
                      (__return_storage_ptr__,iVar2,&local_38);
          }
          else {
            *iVar2._M_current = local_38;
            ppBVar1 = &(__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppBVar1 = *ppBVar1 + 1;
          }
          Blade::~Blade(&local_38);
        }
        pBVar3 = pBVar3 + 1;
      }
    } while (pBVar4 != (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  if (pBVar3 != (B->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      if (1e-06 < ABS(pBVar3->mVal)) {
        Blade::Blade(&local_38,pBVar3->mBase,pBVar3->mVal);
        iVar2._M_current =
             (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Blade,_std::allocator<Blade>_>::_M_realloc_insert<Blade>
                    (__return_storage_ptr__,iVar2,&local_38);
        }
        else {
          *iVar2._M_current = local_38;
          ppBVar1 = &(__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppBVar1 = *ppBVar1 + 1;
        }
        Blade::~Blade(&local_38);
      }
      pBVar3 = pBVar3 + 1;
    } while (pBVar3 != (B->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  if (pBVar4 != (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      if (1e-06 < ABS(pBVar4->mVal)) {
        Blade::Blade(&local_38,pBVar4->mBase,pBVar4->mVal);
        iVar2._M_current =
             (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Blade,_std::allocator<Blade>_>::_M_realloc_insert<Blade>
                    (__return_storage_ptr__,iVar2,&local_38);
        }
        else {
          *iVar2._M_current = local_38;
          ppBVar1 = &(__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppBVar1 = *ppBVar1 + 1;
        }
        Blade::~Blade(&local_38);
      }
      pBVar4 = pBVar4 + 1;
    } while (pBVar4 != (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

Clifford operator+(Clifford A, Clifford B) {
	Clifford C; 
	idx a=A.begin();
	idx b=B.begin();
	while(a!=A.end()&&b!=B.end())
	{
		//switch
		int d=(a->mBase)-(b->mBase);
		if(d<0)
		{C.push_back(Blade(a->mBase,a->mVal));a++;}
		else if(d>0)
		{C.push_back(Blade(b->mBase,b->mVal));b++;}
		else if(0==d)
		{
			float Val=a->mVal+b->mVal;
			if(fabs(Val)>Error2){C.push_back(Blade(a->mBase,Val));}
			a++;b++;
		}
	}
	while(b!=B.end())
	{	
		if(fabs(b->mVal)>Error2){C.push_back(Blade(b->mBase,b->mVal));}
		b++;
	}
	while(a!=A.end())
	{	
		if(fabs(a->mVal)>Error2){C.push_back(Blade(a->mBase,a->mVal));}
		a++;
	}
  return C;
}